

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O3

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::push_back
          (CircularArray<wabt::Token,_2UL> *this,value_type *value)

{
  ulong uVar1;
  Token *this_00;
  
  uVar1 = this->size_;
  if (uVar1 < 2) {
    this->size_ = uVar1 + 1;
    this_00 = (Token *)((long)&(this->contents_)._M_elems[0].loc.filename.data_ +
                       (ulong)(((int)uVar1 + (int)this->front_ & 1U) * 0x50));
    Token::~Token(this_00);
    Token::Token(this_00,value);
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<wabt::Token, 2>::push_back(const value_type &) [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }